

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frac.hpp
# Opt level: O0

Frac<scp::BigInt<unsigned_int,_unsigned_long>_> * __thiscall
scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::operator+=
          (Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *this,
          BigInt<unsigned_int,_unsigned_long> *x)

{
  BigInt<unsigned_int,_unsigned_long> local_38;
  BigInt<unsigned_int,_unsigned_long> *local_18;
  BigInt<unsigned_int,_unsigned_long> *x_local;
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *this_local;
  
  local_18 = x;
  x_local = (BigInt<unsigned_int,_unsigned_long> *)this;
  operator*(&local_38,x,&this->_q);
  BigInt<unsigned_int,_unsigned_long>::operator+=(&this->_p,&local_38);
  BigInt<unsigned_int,_unsigned_long>::~BigInt(&local_38);
  _simplify(this);
  return this;
}

Assistant:

constexpr Frac<TValue>& Frac<TValue>::operator+=(const TValue& x)
	{
		_p += x * _q;
		_simplify();
		return *this;
	}